

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::delete_program(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_18;
  GLuint local_14;
  GLuint notAProgram;
  GLuint shader;
  NegativeTestContext *ctx_local;
  
  _notAProgram = ctx;
  local_14 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  local_18 = glu::CallLogWrapper::glCreateProgram(&_notAProgram->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteProgram(&_notAProgram->super_CallLogWrapper,local_18);
  pNVar1 = _notAProgram;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
             &local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glDeleteProgram(&_notAProgram->super_CallLogWrapper,local_18);
  NegativeTestContext::expectError(_notAProgram,0x501);
  NegativeTestContext::endSection(_notAProgram);
  pNVar1 = _notAProgram;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_OPERATION is generated if program is not zero and is the name of a shader object."
             ,&local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glDeleteProgram(&_notAProgram->super_CallLogWrapper,local_14);
  NegativeTestContext::expectError(_notAProgram,0x502);
  NegativeTestContext::endSection(_notAProgram);
  glu::CallLogWrapper::glDeleteShader(&_notAProgram->super_CallLogWrapper,local_14);
  return;
}

Assistant:

void delete_program (NegativeTestContext& ctx)
{
	GLuint shader = ctx.glCreateShader(GL_VERTEX_SHADER);

	const GLuint notAProgram = ctx.glCreateProgram();
	ctx.glDeleteProgram(notAProgram);

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glDeleteProgram(notAProgram);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not zero and is the name of a shader object.");
	ctx.glDeleteProgram(shader);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteShader(shader);
}